

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

aphy_error aphyGetEngines(aphy_size numengines,aphy_engine **engines,aphy_size *ret_numengines)

{
  Counter *pCVar1;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  ref<aphy::engine> *this;
  ref<aphy::engine> local_20 [2];
  undefined8 *local_10;
  
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 1;
  }
  if ((in_RSI != (undefined8 *)0x0) && (in_EDI != 0)) {
    this = local_20;
    local_10 = in_RSI;
    aphy::makeObject<APhyBullet::BulletEngine>();
    pCVar1 = aphy::ref<aphy::engine>::disown(this);
    *local_10 = pCVar1;
    aphy::ref<aphy::engine>::~ref(this);
  }
  return APHY_OK;
}

Assistant:

APHY_EXPORT aphy_error aphyGetEngines ( aphy_size numengines, aphy_engine** engines, aphy_size* ret_numengines )
{
    using namespace aphy;
    using namespace APhyBullet;

    if(ret_numengines)
        *ret_numengines = 1;

    if(engines && numengines >= 1)
        engines[0] = reinterpret_cast<aphy_engine* > (makeObject<BulletEngine> ().disown());

    return APHY_OK;
}